

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O3

void EXPLORE_EVAL::do_actual_learning<false>
               (explore_eval *data,multi_learner *base,multi_ex *ec_seq)

{
  label_t lVar1;
  cb_class *pcVar2;
  size_t sVar3;
  cb_class *pcVar4;
  example *peVar5;
  cb_class cVar6;
  
  peVar5 = CB_EXPLORE_ADF::test_adf_sequence(ec_seq);
  if (peVar5 == (example *)0x0) {
    LEARNER::multiline_learn_or_predict<false>(base,ec_seq,data->offset,0);
  }
  else {
    lVar1 = (peVar5->l).multi;
    pcVar2 = (cb_class *)(peVar5->l).cs.costs._end;
    sVar3 = (peVar5->l).cs.costs.erase_count;
    (data->action_label).costs.end_array = (cb_class *)(peVar5->l).cs.costs.end_array;
    (data->action_label).costs.erase_count = sVar3;
    (data->action_label).costs._begin = (cb_class *)lVar1;
    (data->action_label).costs._end = pcVar2;
    pcVar2 = (data->empty_label).costs._end;
    pcVar4 = (data->empty_label).costs.end_array;
    sVar3 = (data->empty_label).costs.erase_count;
    (peVar5->l).multi = (label_t)(data->empty_label).costs._begin;
    (peVar5->l).cs.costs._end = (wclass *)pcVar2;
    (peVar5->l).cs.costs.end_array = (wclass *)pcVar4;
    (peVar5->l).cs.costs.erase_count = sVar3;
    LEARNER::multiline_learn_or_predict<false>(base,ec_seq,data->offset,0);
    lVar1 = (label_t)(data->action_label).costs._begin;
    pcVar2 = (data->action_label).costs._end;
    sVar3 = (data->action_label).costs.erase_count;
    (peVar5->l).cs.costs.end_array = (wclass *)(data->action_label).costs.end_array;
    (peVar5->l).cs.costs.erase_count = sVar3;
    (peVar5->l).multi = lVar1;
    (peVar5->l).cs.costs._end = (wclass *)pcVar2;
  }
  cVar6 = CB_ADF::get_observed_cost(ec_seq);
  (data->known_cost).cost = (float)(int)cVar6._0_8_;
  (data->known_cost).action = (int)((ulong)cVar6._0_8_ >> 0x20);
  (data->known_cost).probability = (float)(int)cVar6._8_8_;
  (data->known_cost).partial_prediction = (float)(int)((ulong)cVar6._8_8_ >> 0x20);
  return;
}

Assistant:

void do_actual_learning(explore_eval& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = CB_EXPLORE_ADF::test_adf_sequence(ec_seq);

  if (label_example != nullptr)  // extract label
  {
    data.action_label = label_example->l.cb;
    label_example->l.cb = data.empty_label;
  }
  multiline_learn_or_predict<false>(base, ec_seq, data.offset);

  if (label_example != nullptr)  // restore label
    label_example->l.cb = data.action_label;

  data.known_cost = CB_ADF::get_observed_cost(ec_seq);
  if (label_example != nullptr && is_learn)
  {
    ACTION_SCORE::action_scores& a_s = ec_seq[0]->pred.a_s;

    float action_probability = 0;
    for (size_t i = 0; i < a_s.size(); i++)
      if (data.known_cost.action == a_s[i].action)
        action_probability = a_s[i].score;

    float threshold = action_probability / data.known_cost.probability;

    if (!data.fixed_multiplier)
      data.multiplier = min(data.multiplier, 1 / threshold);
    else
      threshold *= data.multiplier;

    if (threshold > 1. + 1e-6)
      data.violations++;

    if (merand48(data.all->random_state) < threshold)
    {
      example* ec_found = nullptr;
      for (example*& ec : ec_seq)
      {
        if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX && ec->l.cb.costs[0].probability > 0)
          ec_found = ec;
        if (threshold > 1)
          ec->weight *= threshold;
      }
      ec_found->l.cb.costs[0].probability = action_probability;

      multiline_learn_or_predict<true>(base, ec_seq, data.offset);

      if (threshold > 1)
      {
        float inv_threshold = 1.f / threshold;
        for (auto& ec : ec_seq) ec->weight *= inv_threshold;
      }
      ec_found->l.cb.costs[0].probability = data.known_cost.probability;
      data.update_count++;
    }
  }
}